

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O1

UnicodeSet *
icu_63::number::impl::CurrencySpacingEnabledModifier::getUnicodeSet
          (UnicodeSet *__return_storage_ptr__,DecimalFormatSymbols *symbols,EPosition position,
          EAffix affix,UErrorCode *status)

{
  short sVar1;
  UBool UVar2;
  int8_t iVar3;
  UnicodeSet *pUVar4;
  UnicodeString *this;
  int32_t iVar5;
  code *pattern;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((::(anonymous_namespace)::gDefaultCurrencySpacingInitOnce == 2) ||
       (UVar2 = umtx_initImplPreInit
                          ((UInitOnce *)&::(anonymous_namespace)::gDefaultCurrencySpacingInitOnce),
       UVar2 == '\0')) {
      if (U_ZERO_ERROR < DAT_00435774) {
        *status = DAT_00435774;
      }
    }
    else {
      pattern = anon_unknown.dwarf_18b8a7::cleanupDefaultCurrencySpacing;
      ucln_i18n_registerCleanup_63
                (UCLN_I18N_CURRENCY_SPACING,anon_unknown.dwarf_18b8a7::cleanupDefaultCurrencySpacing
                );
      pUVar4 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
      if (pUVar4 == (UnicodeSet *)0x0) {
        ::(anonymous_namespace)::UNISET_DIGIT = (UnicodeSet *)0x0;
      }
      else {
        UnicodeString::UnicodeString(&local_70,L"[:digit:]");
        pattern = (code *)&local_70;
        UnicodeSet::UnicodeSet(pUVar4,(UnicodeString *)pattern,status);
        ::(anonymous_namespace)::UNISET_DIGIT = pUVar4;
        UnicodeString::~UnicodeString(&local_70);
      }
      pUVar4 = (UnicodeSet *)UMemory::operator_new((UMemory *)0x58,(size_t)pattern);
      if (pUVar4 == (UnicodeSet *)0x0) {
        ::(anonymous_namespace)::UNISET_NOTS = (UnicodeSet *)0x0;
      }
      else {
        UnicodeString::UnicodeString(&local_b0,L"[:^S:]");
        UnicodeSet::UnicodeSet(pUVar4,&local_b0,status);
        ::(anonymous_namespace)::UNISET_NOTS = pUVar4;
        UnicodeString::~UnicodeString(&local_b0);
      }
      if ((::(anonymous_namespace)::UNISET_DIGIT == (UnicodeSet *)0x0) ||
         (::(anonymous_namespace)::UNISET_NOTS == (UnicodeSet *)0x0)) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        UnicodeSet::freeze(::(anonymous_namespace)::UNISET_DIGIT);
        UnicodeSet::freeze(::(anonymous_namespace)::UNISET_NOTS);
      }
      DAT_00435774 = *status;
      umtx_initImplPostInit((UInitOnce *)&::(anonymous_namespace)::gDefaultCurrencySpacingInitOnce);
    }
  }
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    this = DecimalFormatSymbols::getPatternForCurrencySpacing
                     (symbols,(uint)(position != IN_CURRENCY),affix == SUFFIX,status);
    sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar5 = (this->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    iVar3 = UnicodeString::doCompare(this,0,iVar5,L"[:digit:]",0,-1);
    pUVar4 = ::(anonymous_namespace)::UNISET_DIGIT;
    if (iVar3 != '\0') {
      sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar5 = (this->fUnion).fFields.fLength;
      }
      else {
        iVar5 = (int)sVar1 >> 5;
      }
      iVar3 = UnicodeString::doCompare(this,0,iVar5,L"[:^S:]",0,-1);
      pUVar4 = ::(anonymous_namespace)::UNISET_NOTS;
      if (iVar3 != '\0') {
        UnicodeSet::UnicodeSet(__return_storage_ptr__,this,status);
        return __return_storage_ptr__;
      }
    }
    UnicodeSet::UnicodeSet(__return_storage_ptr__,pUVar4);
  }
  else {
    UnicodeSet::UnicodeSet(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeSet
CurrencySpacingEnabledModifier::getUnicodeSet(const DecimalFormatSymbols &symbols, EPosition position,
                                              EAffix affix, UErrorCode &status) {
    // Ensure the static defaults are initialized:
    umtx_initOnce(gDefaultCurrencySpacingInitOnce, &initDefaultCurrencySpacing, status);
    if (U_FAILURE(status)) {
        return UnicodeSet();
    }

    const UnicodeString& pattern = symbols.getPatternForCurrencySpacing(
            position == IN_CURRENCY ? UNUM_CURRENCY_MATCH : UNUM_CURRENCY_SURROUNDING_MATCH,
            affix == SUFFIX,
            status);
    if (pattern.compare(u"[:digit:]", -1) == 0) {
        return *UNISET_DIGIT;
    } else if (pattern.compare(u"[:^S:]", -1) == 0) {
        return *UNISET_NOTS;
    } else {
        return UnicodeSet(pattern, status);
    }
}